

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

void htmlDocContentDumpFormatOutput(xmlOutputBufferPtr buf,xmlDocPtr cur,char *encoding,int format)

{
  xmlElementType xVar1;
  
  if (cur == (xmlDocPtr)0x0) {
    xVar1 = 0;
  }
  else {
    xVar1 = cur->type;
    cur->type = XML_HTML_DOCUMENT_NODE;
  }
  htmlNodeDumpFormatOutput(buf,cur,(xmlNodePtr)cur,(char *)0x0,format);
  if (cur != (xmlDocPtr)0x0) {
    cur->type = xVar1;
  }
  return;
}

Assistant:

void
htmlDocContentDumpFormatOutput(xmlOutputBufferPtr buf, xmlDocPtr cur,
	                       const char *encoding ATTRIBUTE_UNUSED,
                               int format) {
    int type = 0;
    if (cur) {
        type = cur->type;
        cur->type = XML_HTML_DOCUMENT_NODE;
    }
    htmlNodeDumpFormatOutput(buf, cur, (xmlNodePtr) cur, NULL, format);
    if (cur)
        cur->type = (xmlElementType) type;
}